

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpTest_Fac_Trace_Test::TestBody(InterpTest_Fac_Trace_Test *this)

{
  DefinedFunc *this_00;
  char *message;
  Result result;
  Values results;
  Result local_dc;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  pointer *local_c8;
  Message local_c0;
  undefined1 local_b8 [16];
  pointer local_a8;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> local_98;
  Ptr local_88;
  Ptr local_70;
  Values local_58;
  AssertHelper local_38;
  
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (anonymous_namespace)::s_fac_module);
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_a8 = (pointer)0x0;
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)local_b8);
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,(long)local_a8 - local_b8._0_8_);
  }
  InterpTest::GetFuncExport(&local_70,&this->super_InterpTest,0);
  local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.root_index_ = 0;
  local_88.obj_ = (Trap *)0x0;
  local_88.store_ = (Store *)0x0;
  wabt::MemoryStream::MemoryStream((MemoryStream *)local_b8,(Stream *)0x0);
  this_00 = local_70.obj_;
  local_d8 = (undefined1  [8])operator_new(0x10);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(((OutputBuffer *)local_d8)->data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  (((OutputBuffer *)local_d8)->data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x2;
  (((OutputBuffer *)local_d8)->data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8 = (pointer *)local_d0;
  local_dc = wabt::interp::Func::Call
                       (&this_00->super_Func,&(this->super_InterpTest).store_,(Values *)local_d8,
                        &local_58,&local_88,(Stream *)local_b8);
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  local_c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)local_d8,"Result::Ok","result",(Enum *)&local_c0,&local_dc);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message(&local_c0);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0xba,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
  }
  else {
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
    wabt::MemoryStream::ReleaseOutputBuffer((MemoryStream *)local_b8);
    InterpTest::ExpectBufferStrEq
              (&this->super_InterpTest,(OutputBuffer *)local_d8,
               "#0.    0: V:1  | alloca 1\n#0.    8: V:2  | i32.const 1\n#0.   16: V:3  | local.set $2, 1\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 2\n#0.   44: V:4  | br_unless @60, 0\n#0.   60: V:3  | local.get $3\n#0.   68: V:4  | i32.mul 1, 2\n#0.   72: V:3  | local.set $2, 2\n#0.   80: V:2  | local.get $2\n#0.   88: V:3  | i32.const 1\n#0.   96: V:4  | i32.sub 2, 1\n#0.  100: V:3  | local.set $3, 1\n#0.  108: V:2  | br @24\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 1\n#0.   44: V:4  | br_unless @60, 0\n#0.   60: V:3  | local.get $3\n#0.   68: V:4  | i32.mul 2, 1\n#0.   72: V:3  | local.set $2, 2\n#0.   80: V:2  | local.get $2\n#0.   88: V:3  | i32.const 1\n#0.   96: V:4  | i32.sub 1, 1\n#0.  100: V:3  | local.set $3, 0\n#0.  108: V:2  | br @24\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 0\n#0.   44: V:4  | br_unless @60, 1\n#0.   52: V:3  | br @116\n#0.  116: V:3  | drop_keep $2 $1\n#0.  128: V:1  | return\n"
              );
    if (local_d8 != (undefined1  [8])0x0) {
      std::default_delete<wabt::OutputBuffer>::operator()
                ((default_delete<wabt::OutputBuffer> *)local_d8,(OutputBuffer *)local_d8);
    }
  }
  local_b8._0_8_ = &PTR__MemoryStream_002430f8;
  if (local_98._M_t.
      super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
      super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
      super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>)0x0) {
    std::default_delete<wabt::OutputBuffer>::operator()
              ((default_delete<wabt::OutputBuffer> *)&local_98,
               (OutputBuffer *)
               local_98._M_t.
               super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
               .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl);
  }
  if (local_88.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_88.store_,local_88.root_index_);
  }
  if (local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.obj_ != (DefinedFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_70.store_,local_70.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpTest, Fac_Trace) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  MemoryStream stream;
  Result result = func->Call(store_, {Value::Make(2)}, results, &trap, &stream);
  ASSERT_EQ(Result::Ok, result);

  auto buf = stream.ReleaseOutputBuffer();
  ExpectBufferStrEq(*buf,
R"(#0.    0: V:1  | alloca 1
#0.    8: V:2  | i32.const 1
#0.   16: V:3  | local.set $2, 1
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 2
#0.   44: V:4  | br_unless @60, 0
#0.   60: V:3  | local.get $3
#0.   68: V:4  | i32.mul 1, 2
#0.   72: V:3  | local.set $2, 2
#0.   80: V:2  | local.get $2
#0.   88: V:3  | i32.const 1
#0.   96: V:4  | i32.sub 2, 1
#0.  100: V:3  | local.set $3, 1
#0.  108: V:2  | br @24
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 1
#0.   44: V:4  | br_unless @60, 0
#0.   60: V:3  | local.get $3
#0.   68: V:4  | i32.mul 2, 1
#0.   72: V:3  | local.set $2, 2
#0.   80: V:2  | local.get $2
#0.   88: V:3  | i32.const 1
#0.   96: V:4  | i32.sub 1, 1
#0.  100: V:3  | local.set $3, 0
#0.  108: V:2  | br @24
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 0
#0.   44: V:4  | br_unless @60, 1
#0.   52: V:3  | br @116
#0.  116: V:3  | drop_keep $2 $1
#0.  128: V:1  | return
)");
}